

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::DGXMLScanner::buildAttList
          (DGXMLScanner *this,XMLSize_t attCount,XMLElementDecl *elemDecl,
          RefVectorOf<xercesc_4_0::XMLAttr> *toFill)

{
  bool bVar1;
  ulong uVar2;
  XMLValidator *pXVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  long *key;
  uint *puVar9;
  XMLCh *pXVar10;
  XMLAttr *this_00;
  XMLCh *text2;
  ulong uVar11;
  undefined4 extraout_var;
  
  iVar5 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])(elemDecl);
  if ((attCount == 0 & ((byte)iVar5 ^ 1)) == 0) {
    if ((byte)iVar5 != 0) {
      uVar2 = (toFill->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fCurCount;
      iVar5 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
      plVar7 = (long *)CONCAT44(extraout_var,iVar5);
      uVar11 = 0;
      while( true ) {
        uVar8 = (**(code **)(*plVar7 + 0x50))(plVar7);
        if (uVar8 <= uVar11) break;
        key = (long *)(**(code **)(*plVar7 + 0x58))(plVar7,uVar11);
        puVar9 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                           (this->fAttDefRegistry,key);
        if ((puVar9 == (uint *)0x0) || (*puVar9 < this->fElemCount)) {
          uVar6 = *(uint *)(key + 1);
          bVar4 = (this->super_XMLScanner).fValidate;
          if ((bool)bVar4 == true) {
            if (uVar6 == 2) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
              XMLValidator::emitError
                        (pXVar3,RequiredAttrNotProvided,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
                         (XMLCh *)0x0);
            }
            else if (uVar6 < 2) {
              if (((this->super_XMLScanner).fStandalone == true) &&
                 (*(char *)((long)key + 0x14) == '\x01')) {
                pXVar3 = (this->super_XMLScanner).fValidator;
                pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
                text2 = XMLElementDecl::getFullName(elemDecl);
                XMLValidator::emitError
                          (pXVar3,NoDefAttForStandalone,pXVar10,text2,(XMLCh *)0x0,(XMLCh *)0x0);
                bVar4 = (this->super_XMLScanner).fValidate;
              }
              goto LAB_002a051d;
            }
          }
          else if (uVar6 < 2) {
LAB_002a051d:
            if ((bVar4 & 1) != 0) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              (*pXVar3->_vptr_XMLValidator[8])(pXVar3,key,key[4],0,elemDecl);
            }
            if (attCount < uVar2) {
              this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                  (&((this->super_XMLScanner).fAttrList)->
                                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,attCount);
              if ((this->super_XMLScanner).fDoNamespaces == true) {
                uVar6 = (this->super_XMLScanner).fEmptyNamespaceId;
                pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
                XMLAttr::set(this_00,uVar6,pXVar10,(XMLCh *)key[4],*(AttTypes *)((long)key + 0xc),
                             (DatatypeValidator *)0x0,false);
              }
              else {
                pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
                XMLAttr::set(this_00,0,pXVar10,L"",(XMLCh *)key[4],*(AttTypes *)((long)key + 0xc),
                             (DatatypeValidator *)0x0,false);
              }
              this_00->fSpecified = false;
            }
            else {
              bVar1 = (this->super_XMLScanner).fDoNamespaces;
              this_00 = (XMLAttr *)
                        XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
              if (bVar1 == true) {
                uVar6 = (this->super_XMLScanner).fEmptyNamespaceId;
                pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
                XMLAttr::XMLAttr(this_00,uVar6,pXVar10,(XMLCh *)key[4],
                                 *(AttTypes *)((long)key + 0xc),false,
                                 (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                 false);
              }
              else {
                pXVar10 = (XMLCh *)(**(code **)(*key + 0x28))(key);
                XMLAttr::XMLAttr(this_00,0,pXVar10,L"",(XMLCh *)key[4],
                                 *(AttTypes *)((long)key + 0xc),false,
                                 (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                 false);
              }
              BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,this_00);
            }
            if ((((this->super_XMLScanner).fDoNamespaces == true) &&
                (pXVar10 = this_00->fAttName->fPrefix, pXVar10 != (XMLCh *)0x0)) &&
               (*pXVar10 != L'\0')) {
              uVar6 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar10,Mode_Attribute);
              XMLAttr::setURIId(this_00,uVar6);
            }
            attCount = attCount + 1;
          }
        }
        uVar11 = uVar11 + 1;
      }
    }
  }
  else {
    attCount = 0;
  }
  return attCount;
}

Assistant:

XMLSize_t
DGXMLScanner::buildAttList(const XMLSize_t              attCount
                          ,       XMLElementDecl*       elemDecl
                          ,       RefVectorOf<XMLAttr>& toFill)
{
    //  Ask the element to clear the 'provided' flag on all of the att defs
    //  that it owns, and to return us a boolean indicating whether it has
    //  any defs.
    const bool hasDefs = elemDecl->hasAttDefs();

    //  If there are no expliclitily provided attributes and there are no
    //  defined attributes for the element, the we don't have anything to do.
    //  So just return zero in this case.
    if (!hasDefs && !attCount)
        return 0;

    // Keep up with how many attrs we end up with total
    XMLSize_t retCount = attCount;

    //  And get the current size of the output vector. This lets us use
    //  existing elements until we fill it, then start adding new ones.
    const XMLSize_t curAttListSize = toFill.size();

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (hasDefs)
    {
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            XMLAttDef& curDef = attDefList.getAttDef(i);

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());
                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (retCount >= curAttListSize)
                    {
                        if (fDoNamespaces)
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }
                        else
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }

                        fAttrList->addElement(curAtt);
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(retCount);
                        if (fDoNamespaces)
                        {
                            curAtt->set
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        else
                        {
                            curAtt->set
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        curAtt->setSpecified(false);
                    }

                    if (fDoNamespaces)
                    {
                        //  Map the new attribute's prefix to a URI id and store
                        //  that in the attribute object.
                        const XMLCh* attPrefix = curAtt->getPrefix();
                        if (attPrefix && *attPrefix) {
                            curAtt->setURIId
                            (
                                resolvePrefix(attPrefix, ElemStack::Mode_Attribute)
                            );
                        }
                    }

                    retCount++;
                }
            }
        }
    }

    return retCount;
}